

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void __thiscall cfd::core::Psbt::SetGlobalXpubkey(Psbt *this,KeyData *key)

{
  bool bVar1;
  CfdException *pCVar2;
  uint32_t *puVar3;
  uint8_t xpub_key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fingerprint;
  Serializer builder;
  vector<unsigned_int,_std::allocator<unsigned_int>_> num_list;
  ByteData key_data;
  ByteData key_top;
  uint8_t local_111;
  ByteData local_110;
  ExtPubkey local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  ByteData local_70;
  ByteData local_58;
  ByteData local_40;
  
  if (this->wally_psbt_pointer_ == (void *)0x0) {
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xc5a;
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = "SetGlobalXpubkey";
    logger::log<>((CfdSourceLocation *)&local_f8,kCfdLogLevelWarning,"psbt pointer is null");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)&local_f8.serialize_data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"psbt pointer is null.","");
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&local_f8);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = KeyData::HasExtPubkey(key);
  if (bVar1) {
    local_111 = '\x01';
    ByteData::ByteData(&local_40,&local_111,1);
    KeyData::GetExtPubkey(&local_f8,key);
    ExtPubkey::GetData(&local_110,&local_f8);
    ByteData::Concat<cfd::core::ByteData>(&local_58,&local_40,&local_110);
    if (local_110.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uint8_t *)0x0) {
      operator_delete(local_110.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.tweak_sum_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f8.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.chaincode_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f8.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.serialize_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    KeyData::GetFingerprint(&local_f8.serialize_data_,key);
    ByteData::GetBytes(&local_110.data_,&local_f8.serialize_data_);
    if (local_f8.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.serialize_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    KeyData::GetChildNumArray(&local_88,key);
    if (3 < (ulong)((long)local_110.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_110.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      Serializer::Serializer
                ((Serializer *)&local_f8,
                 ((int)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                  (int)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start & 0xfffffffcU) + 4);
      Serializer::AddDirectBytes
                ((Serializer *)&local_f8,
                 local_110.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,4);
      puVar3 = (uint32_t *)
               CONCAT44(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)local_88.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
      if (puVar3 != (uint32_t *)
                    CONCAT44(local_88.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish._4_4_,
                             (int)local_88.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish)) {
        do {
          Serializer::AddDirectNumber((Serializer *)&local_f8,*puVar3);
          puVar3 = puVar3 + 1;
        } while (puVar3 != (uint32_t *)
                           CONCAT44(local_88.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    (int)local_88.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish));
      }
      Serializer::Output(&local_70,(Serializer *)&local_f8);
      SetGlobalRecord(this,&local_58,&local_70);
      if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_f8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__Serializer_0072e608;
      if ((void *)CONCAT44(local_f8.serialize_data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           local_f8.serialize_data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_f8.serialize_data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                         local_f8.serialize_data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._0_4_));
      }
      if ((void *)CONCAT44(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           (int)local_88.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_88.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_88.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start));
      }
      if (local_110.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uint8_t *)0x0) {
        operator_delete(local_110.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xc6a;
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = "SetGlobalXpubkey";
    logger::log<>((CfdSourceLocation *)&local_f8,kCfdLogLevelWarning,
                  "psbt fingerprint size low 4 byte.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)&local_f8.serialize_data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"psbt fingerprint size low 4 byte.","");
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_f8);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
  local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xc5f;
  local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = "SetGlobalXpubkey";
  logger::log<>((CfdSourceLocation *)&local_f8,kCfdLogLevelWarning,
                "psbt global xpub can set only ExtPubkey.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_f8.serialize_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"psbt global xpub can set only ExtPubkey.","");
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_f8);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetGlobalXpubkey(const KeyData &key) {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }

  if (!key.HasExtPubkey()) {
    warn(CFD_LOG_SOURCE, "psbt global xpub can set only ExtPubkey.");
    throw CfdException(
        kCfdIllegalArgumentError, "psbt global xpub can set only ExtPubkey.");
  }
  uint8_t xpub_key = Psbt::kPsbtGlobalXpub;
  ByteData key_top(&xpub_key, 1);
  ByteData key_data = key_top.Concat(key.GetExtPubkey().GetData());

  auto fingerprint = key.GetFingerprint().GetBytes();
  auto num_list = key.GetChildNumArray();
  if (fingerprint.size() < 4) {
    warn(CFD_LOG_SOURCE, "psbt fingerprint size low 4 byte.");
    throw CfdException(
        kCfdIllegalArgumentError, "psbt fingerprint size low 4 byte.");
  }
  // if (num_list.empty()) {
  //   warn(CFD_LOG_SOURCE, "psbt empty bip32 path.");
  //   throw CfdException(kCfdIllegalArgumentError, "psbt empty bip32 path.");
  // }
  Serializer builder(4 + (static_cast<uint32_t>(num_list.size()) * 4));
  builder.AddDirectBytes(fingerprint.data(), 4);
  for (const auto child_num : num_list) {
    builder.AddDirectNumber(child_num);
  }
  SetGlobalRecord(key_data, builder.Output());
}